

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textbox_base.cpp
# Opt level: O1

void __thiscall cppurses::detail::Textbox_base::increment_cursor_right(Textbox_base *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar2 = Text_display::index_at
                    (&this->super_Text_display,
                     (this->super_Text_display).super_Widget.cursor.position_);
  if (sVar2 == ((long)(this->super_Text_display).contents_.
                      super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                      super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->super_Text_display).contents_.
                      super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                      super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
    return;
  }
  sVar2 = (this->super_Text_display).top_line_;
  sVar3 = Text_display::display_height(&this->super_Text_display);
  sVar2 = Text_display::first_index_at(&this->super_Text_display,sVar2 + sVar3);
  sVar3 = Text_display::index_at
                    (&this->super_Text_display,
                     (this->super_Text_display).super_Widget.cursor.position_);
  if (sVar3 == sVar2 - 1) {
    sVar2 = (this->super_Text_display).super_Widget.cursor.position_.y;
    sVar1 = (this->super_Text_display).super_Widget.outer_height_;
    sVar4 = Border_offset::north((Widget *)this);
    sVar5 = Border_offset::south((Widget *)this);
    if (sVar2 == ~(sVar5 + sVar4) + sVar1) {
      (*(this->super_Text_display).super_Widget._vptr_Widget[0x2b])(this,1);
    }
  }
  set_cursor(this,sVar3 + 1);
  return;
}

Assistant:

void Textbox_base::increment_cursor_right() {
    if (this->cursor_index() == this->contents().size()) {
        return;
    }
    auto true_last_index = this->first_index_at(this->bottom_line() + 1) - 1;
    auto cursor_index = this->cursor_index();
    if (cursor_index == true_last_index &&
        this->cursor.y() == this->height() - 1) {
        this->scroll_down(1);
    }
    this->set_cursor(cursor_index + 1);
}